

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

bool JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
               (CaseInvariantPropertyListWithHashCode *list1,
               CaseInvariantPropertyListWithHashCode *list2)

{
  code *pcVar1;
  bool bVar2;
  charcount_t len;
  undefined4 *puVar3;
  RecyclerWeakReference<const_Js::PropertyRecord> *this;
  char16 *string_00;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> string;
  PropertyRecord *prop;
  RecyclerWeakReference<const_Js::PropertyRecord> *propRecordWeakRef;
  CaseInvariantPropertyListWithHashCode *list2_local;
  CaseInvariantPropertyListWithHashCode *list1_local;
  
  if ((list1 == (CaseInvariantPropertyListWithHashCode *)0x0) ||
     (list2 == (CaseInvariantPropertyListWithHashCode *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xcc,"(list1 != nullptr && list2 != nullptr)",
                       "list1 != nullptr && list2 != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (list1 == list2) {
    list1_local._7_1_ = true;
  }
  else if (*(int *)&(list1->
                    super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ).field_0x2c ==
           *(int *)&(list2->
                    super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ).field_0x2c) {
    this = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::CompactEnd<true>(&list2->
                               super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             );
    if (this == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
      list1_local._7_1_ = false;
    }
    else {
      string._8_8_ = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::Get(this);
      if ((PropertyRecord *)string._8_8_ == (PropertyRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                           ,0xe3,"(prop)","prop");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      string_00 = Js::PropertyRecord::GetBuffer((PropertyRecord *)string._8_8_);
      len = Js::PropertyRecord::GetLength((PropertyRecord *)string._8_8_);
      CharacterBuffer<char16_t>::CharacterBuffer
                ((CharacterBuffer<char16_t> *)local_40,string_00,len);
      list1_local._7_1_ = Equals(list1,(CharacterBuffer<char16_t> *)local_40);
    }
  }
  else {
    list1_local._7_1_ = false;
  }
  return list1_local._7_1_;
}

Assistant:

bool NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(_In_ Js::CaseInvariantPropertyListWithHashCode* list1, _In_ Js::CaseInvariantPropertyListWithHashCode* list2)
    {
        Assert(list1 != nullptr && list2 != nullptr);

        // If the two lists are the same, they're equal
        if (list1 == list2)
        {
            return true;
        }

        // If they don't have the same case invariant hash code, they're not equal
        if (list1->caseInvariantHashCode != list2->caseInvariantHashCode)
        {
            return false;
        }

        // Find a string from list 2
        // If it's the same when compared with a string from list 1 in a case insensitive way, they're equal
        const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list2->CompactEnd<true>();

        if (propRecordWeakRef != nullptr)
        {
            const Js::PropertyRecord* prop = propRecordWeakRef->Get();

            // Since compaction returned this pointer, their strong refs should not be null
            Assert(prop);

            JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

            return NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(list1, string);
        }

        return false;
    }